

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::draw_pretty(Mesh *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  reference pvVar5;
  pointer pVVar6;
  size_type sVar7;
  _Self local_c8;
  _Self local_c0;
  VertexIter v_2;
  Spectrum white;
  _Self local_a0;
  _Self local_98;
  VertexIter v_1;
  int i;
  Vector3D local_80;
  double local_68;
  undefined1 local_60 [8];
  Vector3D offset;
  _Self local_30;
  VertexIter v;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> offsets;
  Mesh *this_local;
  
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)&v);
  local_30._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(&this->mesh);
  while( true ) {
    offset.z = (double)HalfedgeMesh::verticesEnd(&this->mesh);
    bVar4 = std::operator!=(&local_30,(_Self *)&offset.z);
    if (!bVar4) break;
    pVVar6 = std::_List_iterator<CMU462::Vertex>::operator->(&local_30);
    local_68 = (double)pVVar6->offset;
    pVVar6 = std::_List_iterator<CMU462::Vertex>::operator->(&local_30);
    Vertex::normal(&local_80,pVVar6);
    CMU462::operator*((Vector3D *)local_60,&local_68,&local_80);
    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
              ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)&v,
               (value_type *)local_60);
    std::_List_iterator<CMU462::Vertex>::operator++(&local_30,0);
  }
  v_1._M_node._4_4_ = 0;
  local_98._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(&this->mesh);
  while( true ) {
    local_a0._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(&this->mesh);
    bVar4 = std::operator!=(&local_98,&local_a0);
    if (!bVar4) break;
    sVar7 = (size_type)v_1._M_node._4_4_;
    v_1._M_node._4_4_ = v_1._M_node._4_4_ + 1;
    pvVar5 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                       ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)&v,sVar7);
    pVVar6 = std::_List_iterator<CMU462::Vertex>::operator->(&local_98);
    Vector3D::operator+=(&pVVar6->position,pvVar5);
    std::_List_iterator<CMU462::Vertex>::operator++(&local_98,0);
  }
  glPushMatrix();
  dVar1 = (this->super_SceneObject).position.x;
  dVar2 = (this->super_SceneObject).position.y;
  dVar3 = (this->super_SceneObject).position.z;
  glTranslatef(CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1),
               CONCAT44((int)((ulong)dVar2 >> 0x20),(float)dVar2),
               CONCAT44((int)((ulong)dVar3 >> 0x20),(float)dVar3));
  dVar1 = (this->super_SceneObject).rotation.x;
  glRotatef(CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1),0x3f800000,0);
  dVar1 = (this->super_SceneObject).rotation.y;
  glRotatef(CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1),0,0x3f800000);
  dVar1 = (this->super_SceneObject).rotation.z;
  glRotatef(CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1),0,0,0x3f800000);
  dVar1 = (this->super_SceneObject).scale.x;
  dVar2 = (this->super_SceneObject).scale.y;
  dVar3 = (this->super_SceneObject).scale.z;
  glScalef(CONCAT44((int)((ulong)dVar1 >> 0x20),(float)dVar1),
           CONCAT44((int)((ulong)dVar2 >> 0x20),(float)dVar2),
           CONCAT44((int)((ulong)dVar3 >> 0x20),(float)dVar3));
  if (this->bsdf == (BSDF *)0x0) {
    glBindTexture(0xde1,0);
    Spectrum::Spectrum((Spectrum *)((long)&v_2._M_node + 4),1.0,1.0,1.0);
    glMaterialfv(0x404,0x1201,(undefined1 *)((long)&v_2._M_node + 4));
  }
  else {
    glBindTexture(0xde1,0);
    glMaterialfv(0x404,0x1201,&this->bsdf->rasterize_color);
  }
  glEnable(0xb50);
  glDisable(0xbe2);
  draw_faces(this,true);
  glPopMatrix();
  v_1._M_node._4_4_ = 0;
  local_c0._M_node = (_List_node_base *)HalfedgeMesh::verticesBegin(&this->mesh);
  while( true ) {
    local_c8._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(&this->mesh);
    bVar4 = std::operator!=(&local_c0,&local_c8);
    if (!bVar4) break;
    sVar7 = (size_type)v_1._M_node._4_4_;
    v_1._M_node._4_4_ = v_1._M_node._4_4_ + 1;
    pvVar5 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                       ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)&v,sVar7);
    pVVar6 = std::_List_iterator<CMU462::Vertex>::operator->(&local_c0);
    Vector3D::operator-=(&pVVar6->position,pvVar5);
    std::_List_iterator<CMU462::Vertex>::operator++(&local_c0,0);
  }
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~vector
            ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)&v);
  return;
}

Assistant:

void Mesh::draw_pretty() {

  vector<Vector3D> offsets;

  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    Vector3D offset = v->offset * v->normal();
    offsets.push_back(offset);
  }

  int i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position += offsets[i++];
  }

  glPushMatrix();
  glTranslatef(position.x, position.y, position.z);
  glRotatef(rotation.x, 1.0f, 0.0f, 0.0f);
  glRotatef(rotation.y, 0.0f, 1.0f, 0.0f);
  glRotatef(rotation.z, 0.0f, 0.0f, 1.0f);
  glScalef(scale.x, scale.y, scale.z);

  if (bsdf) {
    glBindTexture(GL_TEXTURE_2D, 0);
    glMaterialfv(GL_FRONT, GL_DIFFUSE, &bsdf->rasterize_color.r);
  } else {
    glBindTexture(GL_TEXTURE_2D, 0);
    Spectrum white = Spectrum(1., 1., 1.);
    glMaterialfv(GL_FRONT, GL_DIFFUSE, &white.r);
  }

	// Enable lighting for faces
  glEnable(GL_LIGHTING);
  glDisable(GL_BLEND);
  draw_faces(true);

  glPopMatrix();

  i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position -= offsets[i++];
  }
}